

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O2

void isobusfs_cmn_dump_last_x_bytes(uint8_t *buffer,size_t buffer_size,size_t x)

{
  uint uVar1;
  ushort **ppuVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  int local_a8;
  char output [80];
  
  uVar5 = buffer_size - x & 0xfffffffffffffff8;
  if (buffer_size <= x) {
    uVar5 = 0;
  }
  uVar3 = uVar5;
  if (x == 0) {
    uVar5 = 0;
    uVar3 = uVar5;
  }
  do {
    if ((buffer_size <= uVar5) ||
       (uVar1 = snprintf(output,0x50,"%08lx: ",uVar5 + uVar3), 0x4f < uVar1)) {
      return;
    }
    pcVar7 = output + uVar1;
    lVar8 = 8;
    uVar4 = uVar5;
    iVar6 = 0x50 - uVar1;
    while ((((bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10 && (uVar4 < buffer_size)) &&
            (uVar1 = snprintf(pcVar7,(long)iVar6,"%02x ",(ulong)buffer[uVar4]), -1 < (int)uVar1)) &&
           (iVar6 - uVar1 != 0 && (int)uVar1 <= iVar6))) {
      pcVar7 = pcVar7 + uVar1;
      uVar4 = uVar4 + 1;
      iVar6 = iVar6 - uVar1;
    }
    local_a8 = (int)uVar5;
    local_a8 = (int)buffer_size - local_a8;
    for (; ((local_a8 < 8 && (uVar1 = snprintf(pcVar7,(long)iVar6,"   "), -1 < (int)uVar1)) &&
           ((int)uVar1 < iVar6)); iVar6 = iVar6 - uVar1) {
      pcVar7 = pcVar7 + uVar1;
      local_a8 = local_a8 + 1;
    }
    uVar1 = snprintf(pcVar7,(long)iVar6,"  ");
    if ((int)uVar1 < 0) {
      return;
    }
    if (iVar6 <= (int)uVar1) {
      return;
    }
    pcVar7 = pcVar7 + uVar1;
    lVar8 = 8;
    iVar6 = iVar6 - uVar1;
    for (uVar4 = uVar5; (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10 && (uVar4 < buffer_size));
        uVar4 = uVar4 + 1) {
      uVar9 = (ulong)buffer[uVar4];
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[uVar9] >> 0xe & 1) == 0) {
        uVar9 = 0x2e;
      }
      uVar1 = snprintf(pcVar7,(long)iVar6,"%c",uVar9);
      if (((int)uVar1 < 0) || (iVar6 - uVar1 == 0 || iVar6 < (int)uVar1)) break;
      pcVar7 = pcVar7 + uVar1;
      iVar6 = iVar6 - uVar1;
    }
    isobusfs_log(LOG_LEVEL_DEBUG,"%s",output);
    if ((int)uVar1 < 0) {
      return;
    }
    uVar5 = uVar5 + 8;
    if (iVar6 <= (int)uVar1) {
      return;
    }
  } while( true );
}

Assistant:

void isobusfs_cmn_dump_last_x_bytes(const uint8_t *buffer, size_t buffer_size,
				    size_t x)
{
	size_t start_offset = 0;
	char *output_ptr;
	unsigned char c;
	int remaining;
	char output[80];
	int n, j;

	if (x > 0 && x < buffer_size)
		start_offset = (buffer_size - x) & ~0x7;

	for (size_t i = start_offset; i < buffer_size; i += 8) {
		output_ptr = output;
		remaining = (int)sizeof(output);

		n = snprintf(output_ptr, remaining, "%08lx: ",
			     (unsigned long)(start_offset + i));
		if (n < 0 || n >= remaining)
			break;

		output_ptr += n;
		remaining -= n;

		for (j = 0; j < 8 && i + j < buffer_size; ++j) {
			n = snprintf(output_ptr, remaining, "%02x ", buffer[i+j]);
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		for (j = buffer_size - i; j < 8; ++j) {
			n = snprintf(output_ptr, remaining, "   ");
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		n = snprintf(output_ptr, remaining, "  ");
		if (n < 0 || n >= remaining)
			break;

		output_ptr += n;
		remaining -= n;

		for (j = 0; j < 8 && i + j < buffer_size; ++j) {
			c = buffer[i+j];
			n = snprintf(output_ptr, remaining, "%c",
				     isprint(c) ? c : '.');
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		pr_debug("%s", output);
		if (n < 0 || n >= remaining)
			break;
	}
}